

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_windows.cpp
# Opt level: O1

void __thiscall Am_Drawonable_Impl::Print(Am_Drawonable_Impl *this,ostream *os)

{
  char *__s;
  size_t sVar1;
  ostream *poVar2;
  
  __s = (this->super_Am_Drawonable).title;
  if (__s == (char *)0x0) {
    std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os," (",2);
  *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) =
       *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar2 = std::ostream::_M_insert<void_const*>(os);
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  return;
}

Assistant:

void
Am_Drawonable_Impl::Print(std::ostream &os) const
{
  os << this->Get_Title();
  os << " (" << std::hex << (void *)this << std::dec << ")";
}